

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

bool __thiscall minja::Value::operator>(Value *this,Value *other)

{
  value_t vVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  runtime_error *prVar5;
  long *plVar6;
  size_type *psVar7;
  size_type __n;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  double local_88;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  vVar1 = (this->primitive_).m_data.m_type;
  if (((((this->object_).
         super___shared_ptr<nlohmann::json_abi_v3_11_3::ordered_map<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value,_std::less<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<const_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_minja::Value>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr == (element_type *)0x0) &&
       ((this->array_).
        super___shared_ptr<std::vector<minja::Value,_std::allocator<minja::Value>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0)) && (vVar1 == null)) &&
     ((this->callable_).
      super___shared_ptr<std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0)) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Undefined value or reference");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (((byte)(vVar1 - number_integer) < 3) &&
     ((byte)((other->primitive_).m_data.m_type - number_integer) < 3)) {
    local_88 = get<double>(this);
    dVar2 = get<double>(other);
    bVar8 = dVar2 < local_88;
  }
  else {
    if ((vVar1 != string) || ((other->primitive_).m_data.m_type != string)) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      dump_abi_cxx11_(&local_60,this,-1,false);
      std::operator+(&local_40,"Cannot compare values: ",&local_60);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_40);
      local_c8._M_dataplus._M_p = (pointer)*plVar6;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_c8._M_dataplus._M_p == psVar7) {
        local_c8.field_2._M_allocated_capacity = *psVar7;
        local_c8.field_2._8_8_ = plVar6[3];
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar7;
      }
      local_c8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      dump_abi_cxx11_(&local_80,other,-1,false);
      std::operator+(&local_a8,&local_c8,&local_80);
      std::runtime_error::runtime_error(prVar5,(string *)&local_a8);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    get<std::__cxx11::string>(&local_a8,this);
    get<std::__cxx11::string>(&local_c8,other);
    __n = local_a8._M_string_length;
    if (local_c8._M_string_length < local_a8._M_string_length) {
      __n = local_c8._M_string_length;
    }
    if (__n == 0) {
      uVar4 = 0;
    }
    else {
      uVar3 = memcmp(local_a8._M_dataplus._M_p,local_c8._M_dataplus._M_p,__n);
      uVar4 = (ulong)uVar3;
    }
    if ((int)uVar4 == 0) {
      uVar4 = 0xffffffff80000000;
      if (-0x80000000 < (long)(local_a8._M_string_length - local_c8._M_string_length)) {
        uVar4 = local_a8._M_string_length - local_c8._M_string_length;
      }
      if (0x7ffffffe < (long)uVar4) {
        uVar4 = 0x7fffffff;
      }
    }
    bVar8 = 0 < (int)uVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar8;
}

Assistant:

bool operator>(const Value & other) const {
    if (is_null())
      throw std::runtime_error("Undefined value or reference");
    if (is_number() && other.is_number()) return get<double>() > other.get<double>();
    if (is_string() && other.is_string()) return get<std::string>() > other.get<std::string>();
    throw std::runtime_error("Cannot compare values: " + dump() + " > " + other.dump());
  }